

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O2

Symbol * __thiscall
slang::ast::anon_unknown_287::recursePrimArray
          (anon_unknown_287 *this,Compilation *comp,PrimitiveSymbol *primitive,
          HierarchicalInstanceSyntax *instance,ASTContext *context,DimIterator it,DimIterator end,
          span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
          attributes,SmallVectorBase<unsigned_int> *path)

{
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> attributes_00;
  pointer ppSVar1;
  int iVar2;
  SymbolIndex SVar3;
  int iVar4;
  Diagnostic *pDVar5;
  SourceLocation SVar6;
  InstanceArraySymbol *pIVar7;
  Symbol *pSVar8;
  undefined4 extraout_var;
  int iVar9;
  EVP_PKEY_CTX *src;
  SourceLocation SVar10;
  long lVar11;
  long lVar12;
  SourceRange sourceRange;
  string_view sVar13;
  string_view name;
  __extent_storage<18446744073709551615UL> in_stack_ffffffffffffff00;
  Token nameToken;
  Symbol *symbol;
  char *local_c8;
  VariableDimensionSyntax *local_c0;
  PrimitiveSymbol *local_b8;
  span<const_slang::ast::Symbol_*,_18446744073709551615UL> local_b0;
  SourceLocation local_a0;
  ConstantRange range;
  SmallVector<const_slang::ast::Symbol_*,_5UL> elements;
  EvaluatedDimension dim;
  
  if (context == (ASTContext *)it._M_current) {
    attributes_00._M_extent._M_extent_value = in_stack_ffffffffffffff00._M_extent_value;
    attributes_00._M_ptr = (pointer)attributes._M_extent._M_extent_value;
    pIVar7 = (InstanceArraySymbol *)
             createPrimInst(this,*(Compilation **)&instance->super_SyntaxNode,(Scope *)comp,
                            primitive,(HierarchicalInstanceSyntax *)end._M_current,attributes_00,
                            (SmallVectorBase<unsigned_int> *)attributes._M_ptr);
  }
  else {
    SVar10 = (primitive->super_Symbol).location;
    nameToken._0_8_ = *(undefined8 *)((long)SVar10 + 0x18);
    nameToken.info = *(Info **)((long)SVar10 + 0x20);
    local_c0 = (VariableDimensionSyntax *)(context->scope).ptr;
    SVar10 = (SourceLocation)0x0;
    ASTContext::evalDimension(&dim,(ASTContext *)instance,local_c0,true,false);
    if (dim.kind - Range < 2) {
      iVar2 = dim.range.left;
      iVar9 = dim.range.right;
      iVar4 = iVar2 - iVar9;
      if (iVar2 - iVar9 == 0 || iVar2 < iVar9) {
        iVar4 = -(iVar2 - iVar9);
      }
      range = dim.range;
      local_b8 = primitive;
      if (iVar4 + 1 <= (((InstanceArraySymbol *)this)->super_Symbol).indexInScope) {
        elements.super_SmallVectorBase<const_slang::ast::Symbol_*>.data_ =
             (pointer)elements.super_SmallVectorBase<const_slang::ast::Symbol_*>.firstElement;
        elements.super_SmallVectorBase<const_slang::ast::Symbol_*>.len = 0;
        elements.super_SmallVectorBase<const_slang::ast::Symbol_*>.cap = 5;
        SVar3 = 0;
        while( true ) {
          local_b0._M_ptr = (pointer)CONCAT44(local_b0._M_ptr._4_4_,SVar3);
          if (iVar4 + 1 <= SVar3) break;
          SmallVectorBase<unsigned_int>::emplace_back<unsigned_int_const&>
                    ((SmallVectorBase<unsigned_int> *)attributes._M_extent._M_extent_value,
                     (uint *)&local_b0);
          pSVar8 = recursePrimArray(this,comp,local_b8,instance,(ASTContext *)&context->lookupIndex,
                                    it,end,attributes,(SmallVectorBase<unsigned_int> *)this);
          symbol = pSVar8;
          *(long *)(attributes._M_extent._M_extent_value + 8) =
               *(long *)(attributes._M_extent._M_extent_value + 8) + -1;
          (pSVar8->name)._M_len = 0;
          (pSVar8->name)._M_str = "";
          SmallVectorBase<slang::ast::Symbol_const*>::emplace_back<slang::ast::Symbol_const*const&>
                    ((SmallVectorBase<slang::ast::Symbol_const*> *)&elements,&symbol);
          SVar3 = (int)local_b0._M_ptr + 1;
        }
        _symbol = parsing::Token::valueText(&nameToken);
        local_a0 = parsing::Token::location(&nameToken);
        iVar4 = SmallVectorBase<const_slang::ast::Symbol_*>::copy
                          (&elements.super_SmallVectorBase<const_slang::ast::Symbol_*>,
                           (EVP_PKEY_CTX *)this,src);
        local_b0._M_ptr = (pointer)CONCAT44(extraout_var,iVar4);
        pIVar7 = BumpAllocator::
                 emplace<slang::ast::InstanceArraySymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,std::span<slang::ast::Symbol_const*,18446744073709551615ul>,slang::ConstantRange&>
                           ((BumpAllocator *)this,(Compilation *)this,
                            (basic_string_view<char,_std::char_traits<char>_> *)&symbol,&local_a0,
                            &local_b0,&range);
        ppSVar1 = elements.super_SmallVectorBase<const_slang::ast::Symbol_*>.data_;
        lVar11 = elements.super_SmallVectorBase<const_slang::ast::Symbol_*>.len << 3;
        for (lVar12 = 0; lVar11 != lVar12; lVar12 = lVar12 + 8) {
          this = *(anon_unknown_287 **)((long)ppSVar1 + lVar12);
          Scope::addMember(&pIVar7->super_Scope,(Symbol *)this);
        }
        SmallVectorBase<const_slang::ast::Symbol_*>::cleanup
                  (&elements.super_SmallVectorBase<const_slang::ast::Symbol_*>,(EVP_PKEY_CTX *)this)
        ;
        return &pIVar7->super_Symbol;
      }
      sourceRange = slang::syntax::SyntaxNode::sourceRange(&local_c0->super_SyntaxNode);
      pDVar5 = ASTContext::addDiag((ASTContext *)instance,(DiagCode)0x6d0006,sourceRange);
      sVar13._M_str = "primitive";
      sVar13._M_len = 9;
      pDVar5 = Diagnostic::operator<<(pDVar5,sVar13);
      Diagnostic::operator<<<unsigned_int>
                (pDVar5,(((InstanceArraySymbol *)this)->super_Symbol).indexInScope);
      sVar13 = parsing::Token::valueText(&nameToken);
      SVar6 = parsing::Token::location(&nameToken);
    }
    else {
      sVar13 = parsing::Token::valueText(&nameToken);
      SVar6 = parsing::Token::location(&nameToken);
    }
    name._M_str = (char *)SVar6;
    name._M_len = (size_t)sVar13._M_str;
    pIVar7 = InstanceArraySymbol::createEmpty
                       ((InstanceArraySymbol *)this,(Compilation *)sVar13._M_len,name,SVar10);
  }
  return &pIVar7->super_Symbol;
}

Assistant:

Symbol* recursePrimArray(Compilation& comp, const PrimitiveSymbol& primitive,
                         const HierarchicalInstanceSyntax& instance, const ASTContext& context,
                         DimIterator it, DimIterator end,
                         std::span<const AttributeInstanceSyntax* const> attributes,
                         SmallVectorBase<uint32_t>& path) {
    if (it == end)
        return createPrimInst(comp, *context.scope, primitive, instance, attributes, path);

    SLANG_ASSERT(instance.decl);
    auto nameToken = instance.decl->name;
    auto& dimSyntax = **it;
    ++it;

    // Evaluate the dimensions of the array. If this fails for some reason,
    // make up an empty array so that we don't get further errors when
    // things try to reference this symbol.
    auto dim = context.evalDimension(dimSyntax, /* requireRange */ true, /* isPacked */ false);
    if (!dim.isRange())
        return &InstanceArraySymbol::createEmpty(comp, nameToken.valueText(), nameToken.location());

    ConstantRange range = dim.range;
    if (range.width() > comp.getOptions().maxInstanceArray) {
        auto& diag = context.addDiag(diag::MaxInstanceArrayExceeded, dimSyntax.sourceRange());
        diag << "primitive"sv << comp.getOptions().maxInstanceArray;
        return &InstanceArraySymbol::createEmpty(comp, nameToken.valueText(), nameToken.location());
    }

    SmallVector<const Symbol*> elements;
    for (uint32_t i = 0; i < range.width(); i++) {
        path.push_back(i);
        auto symbol = recursePrimArray(comp, primitive, instance, context, it, end, attributes,
                                       path);
        path.pop_back();

        symbol->name = "";
        elements.push_back(symbol);
    }

    auto result = comp.emplace<InstanceArraySymbol>(comp, nameToken.valueText(),
                                                    nameToken.location(), elements.copy(comp),
                                                    range);
    for (auto element : elements)
        result->addMember(*element);

    return result;
}